

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O3

int output_nbits(Buffer *buffer,int bits,int n)

{
  Buffer_t *pBVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  uVar4 = buffer->bitbuffer;
  iVar3 = buffer->bits_to_go;
  if (0x20 < iVar3 + n) {
    n = n - iVar3;
    uVar4 = uVar4 << ((byte)iVar3 & 0x1f) | bits >> ((byte)n & 0x1f) & output_nbits::mask[iVar3];
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)uVar4;
    iVar3 = 8;
  }
  uVar4 = bits & output_nbits::mask[n] | uVar4 << ((byte)n & 0x1f);
  iVar5 = iVar3 - n;
  if (iVar5 == 0 || iVar3 < n) {
    iVar3 = n - iVar3;
    iVar6 = iVar5;
    do {
      pBVar1 = buffer->current;
      buffer->current = pBVar1 + 1;
      *pBVar1 = (Buffer_t)((int)uVar4 >> ((byte)iVar3 & 0x1f));
      iVar5 = iVar6 + 8;
      iVar3 = iVar3 + -8;
      bVar2 = iVar6 < -7;
      iVar6 = iVar5;
    } while (bVar2);
  }
  buffer->bitbuffer = uVar4;
  buffer->bits_to_go = iVar5;
  return iVar5;
}

Assistant:

static void
output_nbits(char *outfile, int bits, int n)
{
    /* AND mask for the right-most n bits */
    static int mask[9] = {0, 1, 3, 7, 15, 31, 63, 127, 255};
	/*
	 * insert bits at end of buffer
	 */
	buffer2 <<= n;
/*	buffer2 |= ( bits & ((1<<n)-1) ); */
	buffer2 |= ( bits & (*(mask+n)) );
	bits_to_go2 -= n;
	if (bits_to_go2 <= 0) {
		/*
		 * buffer2 full, put out top 8 bits
		 */

	        outfile[noutchar] = ((buffer2>>(-bits_to_go2)) & 0xff);

		if (noutchar < noutmax) noutchar++;
		
		bits_to_go2 += 8;
	}
	bitcount += n;
}